

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChUtilsInputOutput.cpp
# Opt level: O2

void chrono::utils::WriteVisualizationAssets
               (ChSystem *system,string *filename,function<bool_(const_chrono::ChBody_&)> *selector,
               bool body_info,string *delim)

{
  _func_int **pp_Var1;
  __shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2> *p_Var2;
  __shared_ptr<chrono::ChLinkBase,_(__gnu_cxx::_Lock_policy)2> *p_Var3;
  long lVar4;
  element_type *peVar5;
  element_type *peVar6;
  element_type *peVar7;
  element_type *peVar8;
  element_type *peVar9;
  ChBody *pCVar10;
  bool bVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  CSV_writer *pCVar15;
  undefined4 extraout_var_01;
  ostream *poVar16;
  undefined7 in_register_00000009;
  pair<std::shared_ptr<chrono::ChVisualShape>,_chrono::ChFrame<double>_> *shape_instance;
  __shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2> *p_Var17;
  __shared_ptr<chrono::ChLinkBase,_(__gnu_cxx::_Lock_policy)2> *p_Var18;
  _func_int **pp_Var19;
  __shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2> *p_Var20;
  int local_55c;
  shared_ptr<chrono::ChBody> body_1;
  int local_534;
  shared_ptr<chrono::ChRoundedCylinderShape> rcyl;
  shared_ptr<chrono::ChCapsuleShape> capsule;
  shared_ptr<chrono::ChBoxShape> box;
  shared_ptr<chrono::ChEllipsoidShape> ellipsoid;
  shared_ptr<chrono::ChRoundedBoxShape> rbox;
  shared_ptr<chrono::ChConeShape> cone;
  shared_ptr<chrono::ChCylinderShape> cylinder;
  shared_ptr<chrono::ChTriangleMeshShape> mesh;
  shared_ptr<chrono::ChLineShape> line;
  shared_ptr<chrono::ChSphereShape> sphere;
  ChFrame<double> X_GS;
  shared_ptr<chrono::geometry::ChLineBezier> bezier;
  shared_ptr<chrono::geometry::ChLine> geom;
  stringstream header;
  undefined4 uStack_34c;
  ChVector<double> local_348 [2];
  element_type *local_310;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_2f8;
  CSV_writer csv;
  
  CSV_writer::CSV_writer(&csv,delim);
  local_55c = 0;
  local_534 = 0;
  if ((int)CONCAT71(in_register_00000009,body_info) != 0) {
    p_Var17 = &((system->assembly).bodylist.
                super__Vector_base<std::shared_ptr<chrono::ChBody>,_std::allocator<std::shared_ptr<chrono::ChBody>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->
               super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>;
    p_Var20 = &((system->assembly).bodylist.
                super__Vector_base<std::shared_ptr<chrono::ChBody>,_std::allocator<std::shared_ptr<chrono::ChBody>_>_>
                ._M_impl.super__Vector_impl_data._M_finish)->
               super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>;
    local_534 = 0;
    for (; p_Var17 != p_Var20; p_Var17 = p_Var17 + 1) {
      std::__shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2> *)&header,p_Var17);
      bVar11 = std::function<bool_(const_chrono::ChBody_&)>::operator()(selector,_header);
      if (bVar11) {
        iVar12 = (*(_header->super_ChPhysicsItem).super_ChObj._vptr_ChObj[0x3e])();
        iVar13 = (*(_header->super_ChPhysicsItem).super_ChObj._vptr_ChObj[0x3e])();
        X_GS._vptr_ChFrame._0_4_ = (_header->super_ChPhysicsItem).super_ChObj.m_identifier;
        pCVar15 = CSV_writer::operator<<(&csv,(int *)&X_GS);
        iVar14 = (*(_header->super_ChPhysicsItem).super_ChObj._vptr_ChObj[9])();
        sphere.super___shared_ptr<chrono::ChSphereShape,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)
             CONCAT71(sphere.super___shared_ptr<chrono::ChSphereShape,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr._1_7_,(char)iVar14);
        pCVar15 = CSV_writer::operator<<(pCVar15,(bool *)&sphere);
        pCVar15 = operator<<(pCVar15,(ChVector<double> *)(CONCAT44(extraout_var,iVar12) + 8));
        pCVar15 = operator<<(pCVar15,(ChQuaternion<double> *)
                                     (CONCAT44(extraout_var_00,iVar13) + 0x20));
        std::endl<char,std::char_traits<char>>((ostream *)&pCVar15->m_ss);
        local_534 = local_534 + 1;
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_348);
    }
  }
  p_Var17 = &((system->assembly).bodylist.
              super__Vector_base<std::shared_ptr<chrono::ChBody>,_std::allocator<std::shared_ptr<chrono::ChBody>_>_>
              ._M_impl.super__Vector_impl_data._M_finish)->
             super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>;
  for (p_Var20 = &((system->assembly).bodylist.
                   super__Vector_base<std::shared_ptr<chrono::ChBody>,_std::allocator<std::shared_ptr<chrono::ChBody>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->
                  super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>; p_Var20 != p_Var17
      ; p_Var20 = p_Var20 + 1) {
    std::__shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&body_1.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>,p_Var20);
    bVar11 = std::function<bool_(const_chrono::ChBody_&)>::operator()
                       (selector,body_1.
                                 super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr);
    if (bVar11) {
      ChPhysicsItem::GetVisualModel((ChPhysicsItem *)&header);
      pCVar10 = _header;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_348);
      if (pCVar10 != (ChBody *)0x0) {
        ChPhysicsItem::GetVisualModel((ChPhysicsItem *)&header);
        pCVar10 = _header;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_348);
        pp_Var1 = (_func_int **)(pCVar10->super_ChPhysicsItem).super_ChObj.m_name._M_dataplus._M_p;
        for (pp_Var19 = (pCVar10->super_ChPhysicsItem).super_ChObj._vptr_ChObj; pp_Var19 != pp_Var1;
            pp_Var19 = pp_Var19 + 0x13) {
          iVar12 = (*((body_1.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                     ->super_ChPhysicsItem).super_ChObj._vptr_ChObj[0x3e])();
          chrono::operator*(&X_GS,(ChFrameMoving<double> *)CONCAT44(extraout_var_01,iVar12),
                            (ChFrame<double> *)(pp_Var19 + 2));
          std::__cxx11::stringstream::stringstream((stringstream *)&header);
          std::dynamic_pointer_cast<chrono::ChSphereShape,chrono::ChVisualShape>
                    ((shared_ptr<chrono::ChVisualShape> *)&sphere);
          if (sphere.super___shared_ptr<chrono::ChSphereShape,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            std::dynamic_pointer_cast<chrono::ChEllipsoidShape,chrono::ChVisualShape>
                      ((shared_ptr<chrono::ChVisualShape> *)&ellipsoid);
            peVar5 = ellipsoid.
                     super___shared_ptr<chrono::ChEllipsoidShape,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            ;
            if (ellipsoid.super___shared_ptr<chrono::ChEllipsoidShape,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr == (element_type *)0x0) {
              std::dynamic_pointer_cast<chrono::ChBoxShape,chrono::ChVisualShape>
                        ((shared_ptr<chrono::ChVisualShape> *)&box);
              lVar4 = CONCAT44(box.
                               super___shared_ptr<chrono::ChBoxShape,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr._4_4_,
                               (int)box.
                                    super___shared_ptr<chrono::ChBoxShape,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr);
              if (lVar4 == 0) {
                std::dynamic_pointer_cast<chrono::ChCapsuleShape,chrono::ChVisualShape>
                          ((shared_ptr<chrono::ChVisualShape> *)&capsule);
                lVar4 = CONCAT71(capsule.
                                 super___shared_ptr<chrono::ChCapsuleShape,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr._1_7_,
                                 capsule.
                                 super___shared_ptr<chrono::ChCapsuleShape,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr._0_1_);
                if (lVar4 == 0) {
                  std::dynamic_pointer_cast<chrono::ChCylinderShape,chrono::ChVisualShape>
                            ((shared_ptr<chrono::ChVisualShape> *)&cylinder);
                  peVar8 = cylinder.
                           super___shared_ptr<chrono::ChCylinderShape,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr;
                  if (cylinder.
                      super___shared_ptr<chrono::ChCylinderShape,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                      == (element_type *)0x0) {
                    std::dynamic_pointer_cast<chrono::ChConeShape,chrono::ChVisualShape>
                              ((shared_ptr<chrono::ChVisualShape> *)&cone);
                    peVar7 = cone.
                             super___shared_ptr<chrono::ChConeShape,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr;
                    if (cone.super___shared_ptr<chrono::ChConeShape,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr == (element_type *)0x0) {
                      std::dynamic_pointer_cast<chrono::ChRoundedBoxShape,chrono::ChVisualShape>
                                ((shared_ptr<chrono::ChVisualShape> *)&rbox);
                      peVar6 = rbox.
                               super___shared_ptr<chrono::ChRoundedBoxShape,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr;
                      if (rbox.
                          super___shared_ptr<chrono::ChRoundedBoxShape,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr == (element_type *)0x0) {
                        std::
                        dynamic_pointer_cast<chrono::ChRoundedCylinderShape,chrono::ChVisualShape>
                                  ((shared_ptr<chrono::ChVisualShape> *)&rcyl);
                        lVar4 = CONCAT44(rcyl.
                                         super___shared_ptr<chrono::ChRoundedCylinderShape,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr._4_4_,
                                         rcyl.
                                         super___shared_ptr<chrono::ChRoundedCylinderShape,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr._0_4_);
                        if (lVar4 == 0) {
                          std::
                          dynamic_pointer_cast<chrono::ChTriangleMeshShape,chrono::ChVisualShape>
                                    ((shared_ptr<chrono::ChVisualShape> *)&mesh);
                          if (CONCAT44(mesh.
                                       super___shared_ptr<chrono::ChTriangleMeshShape,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr._4_4_,
                                       mesh.
                                       super___shared_ptr<chrono::ChTriangleMeshShape,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr._0_4_) == 0) {
                            std::dynamic_pointer_cast<chrono::ChLineShape,chrono::ChVisualShape>
                                      ((shared_ptr<chrono::ChVisualShape> *)&line);
                            if (line.
                                super___shared_ptr<chrono::ChLineShape,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr == (element_type *)0x0) {
                              bVar11 = false;
                            }
                            else {
                              std::
                              __shared_ptr<chrono::geometry::ChLine,_(__gnu_cxx::_Lock_policy)2>::
                              __shared_ptr(&geom.
                                            super___shared_ptr<chrono::geometry::ChLine,_(__gnu_cxx::_Lock_policy)2>
                                           ,&((line.
                                               super___shared_ptr<chrono::ChLineShape,_(__gnu_cxx::_Lock_policy)2>
                                              ._M_ptr)->gline).
                                             super___shared_ptr<chrono::geometry::ChLine,_(__gnu_cxx::_Lock_policy)2>
                                          );
                              std::
                              dynamic_pointer_cast<chrono::geometry::ChLineBezier,chrono::geometry::ChLine>
                                        ((shared_ptr<chrono::geometry::ChLine> *)&bezier);
                              bVar11 = bezier.
                                       super___shared_ptr<chrono::geometry::ChLineBezier,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr != (element_type *)0x0;
                              if (bVar11) {
                                poVar16 = (ostream *)
                                          std::ostream::operator<<(local_348[0].m_data + 1,0xc);
                                poVar16 = std::operator<<(poVar16,(string *)delim);
                                poVar16 = std::operator<<(poVar16,"\"");
                                poVar16 = std::operator<<(poVar16,(string *)
                                                                  &(line.
                                                  super___shared_ptr<chrono::ChLineShape,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr)->name);
                                std::operator<<(poVar16,"\"");
                                local_55c = local_55c + 1;
                              }
                              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                                        (&bezier.
                                          super___shared_ptr<chrono::geometry::ChLineBezier,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_refcount);
                              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                                        (&geom.
                                          super___shared_ptr<chrono::geometry::ChLine,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_refcount);
                            }
                            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                                      (&line.
                                        super___shared_ptr<chrono::ChLineShape,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount);
                          }
                          else {
                            poVar16 = (ostream *)std::ostream::operator<<(local_348[0].m_data + 1,5)
                            ;
                            poVar16 = std::operator<<(poVar16,(string *)delim);
                            poVar16 = std::operator<<(poVar16,"\"");
                            poVar16 = std::operator<<(poVar16,(string *)
                                                              (CONCAT44(mesh.
                                                  super___shared_ptr<chrono::ChTriangleMeshShape,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr._4_4_,
                                                  mesh.
                                                  super___shared_ptr<chrono::ChTriangleMeshShape,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr._0_4_) + 0x40));
                            std::operator<<(poVar16,"\"");
                            local_55c = local_55c + 1;
                            bVar11 = true;
                          }
                          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                                    (&mesh.
                                      super___shared_ptr<chrono::ChTriangleMeshShape,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_refcount);
                        }
                        else {
                          poVar16 = (ostream *)std::ostream::operator<<(local_348[0].m_data + 1,10);
                          std::operator<<(poVar16,(string *)delim);
                          poVar16 = std::ostream::_M_insert<double>(*(double *)(lVar4 + 0x30));
                          std::operator<<(poVar16,(string *)delim);
                          poVar16 = std::ostream::_M_insert<double>(*(double *)(lVar4 + 0x38));
                          std::operator<<(poVar16,(string *)delim);
                          std::ostream::_M_insert<double>(*(double *)(lVar4 + 0x40));
                          local_55c = local_55c + 1;
                          bVar11 = true;
                        }
                        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                                  (&rcyl.
                                    super___shared_ptr<chrono::ChRoundedCylinderShape,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount);
                      }
                      else {
                        poVar16 = (ostream *)std::ostream::operator<<(local_348[0].m_data + 1,9);
                        std::operator<<(poVar16,(string *)delim);
                        poVar16 = std::ostream::_M_insert<double>
                                            ((peVar6->groundedbox).Size.m_data[0]);
                        std::operator<<(poVar16,(string *)delim);
                        poVar16 = std::ostream::_M_insert<double>
                                            ((peVar6->groundedbox).Size.m_data[1]);
                        std::operator<<(poVar16,(string *)delim);
                        poVar16 = std::ostream::_M_insert<double>
                                            ((peVar6->groundedbox).Size.m_data[2]);
                        std::operator<<(poVar16,(string *)delim);
                        std::ostream::_M_insert<double>((peVar6->groundedbox).radsphere);
                        local_55c = local_55c + 1;
                        bVar11 = true;
                      }
                      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                                (&rbox.
                                  super___shared_ptr<chrono::ChRoundedBoxShape,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount);
                    }
                    else {
                      poVar16 = (ostream *)std::ostream::operator<<(local_348[0].m_data + 1,8);
                      std::operator<<(poVar16,(string *)delim);
                      poVar16 = std::ostream::_M_insert<double>((peVar7->gcone).rad.m_data[0]);
                      std::operator<<(poVar16,(string *)delim);
                      std::ostream::_M_insert<double>((peVar7->gcone).rad.m_data[1]);
                      local_55c = local_55c + 1;
                      bVar11 = true;
                    }
                    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                              (&cone.
                                super___shared_ptr<chrono::ChConeShape,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount);
                  }
                  else {
                    poVar16 = (ostream *)std::ostream::operator<<(local_348[0].m_data + 1,3);
                    std::operator<<(poVar16,(string *)delim);
                    poVar16 = std::ostream::_M_insert<double>((peVar8->gcylinder).rad);
                    std::operator<<(poVar16,(string *)delim);
                    poVar16 = std::ostream::_M_insert<double>((peVar8->gcylinder).p1.m_data[0]);
                    std::operator<<(poVar16,(string *)delim);
                    poVar16 = std::ostream::_M_insert<double>((peVar8->gcylinder).p1.m_data[1]);
                    std::operator<<(poVar16,(string *)delim);
                    poVar16 = std::ostream::_M_insert<double>((peVar8->gcylinder).p1.m_data[2]);
                    std::operator<<(poVar16,(string *)delim);
                    poVar16 = std::ostream::_M_insert<double>((peVar8->gcylinder).p2.m_data[0]);
                    std::operator<<(poVar16,(string *)delim);
                    poVar16 = std::ostream::_M_insert<double>((peVar8->gcylinder).p2.m_data[1]);
                    std::operator<<(poVar16,(string *)delim);
                    std::ostream::_M_insert<double>((peVar8->gcylinder).p2.m_data[2]);
                    local_55c = local_55c + 1;
                    bVar11 = true;
                  }
                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                            (&cylinder.
                              super___shared_ptr<chrono::ChCylinderShape,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount);
                }
                else {
                  poVar16 = (ostream *)std::ostream::operator<<(local_348[0].m_data + 1,7);
                  std::operator<<(poVar16,(string *)delim);
                  poVar16 = std::ostream::_M_insert<double>(*(double *)(lVar4 + 0x30));
                  std::operator<<(poVar16,(string *)delim);
                  std::ostream::_M_insert<double>(*(double *)(lVar4 + 0x38));
                  local_55c = local_55c + 1;
                  bVar11 = true;
                }
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                          (&capsule.
                            super___shared_ptr<chrono::ChCapsuleShape,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
              }
              else {
                poVar16 = (ostream *)std::ostream::operator<<(local_348[0].m_data + 1,2);
                std::operator<<(poVar16,(string *)delim);
                poVar16 = std::ostream::_M_insert<double>(*(double *)(lVar4 + 0x30));
                std::operator<<(poVar16,(string *)delim);
                poVar16 = std::ostream::_M_insert<double>(*(double *)(lVar4 + 0x38));
                std::operator<<(poVar16,(string *)delim);
                std::ostream::_M_insert<double>(*(double *)(lVar4 + 0x40));
                local_55c = local_55c + 1;
                bVar11 = true;
              }
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        (&box.super___shared_ptr<chrono::ChBoxShape,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
            }
            else {
              poVar16 = (ostream *)std::ostream::operator<<(local_348[0].m_data + 1,1);
              std::operator<<(poVar16,(string *)delim);
              poVar16 = std::ostream::_M_insert<double>((peVar5->gellipsoid).rad.m_data[0]);
              std::operator<<(poVar16,(string *)delim);
              poVar16 = std::ostream::_M_insert<double>((peVar5->gellipsoid).rad.m_data[1]);
              std::operator<<(poVar16,(string *)delim);
              std::ostream::_M_insert<double>((peVar5->gellipsoid).rad.m_data[2]);
              local_55c = local_55c + 1;
              bVar11 = true;
            }
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&ellipsoid.
                        super___shared_ptr<chrono::ChEllipsoidShape,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
          }
          else {
            poVar16 = (ostream *)std::ostream::operator<<(local_348[0].m_data + 1,0);
            std::operator<<(poVar16,(string *)delim);
            std::ostream::_M_insert<double>
                      (((sphere.
                         super___shared_ptr<chrono::ChSphereShape,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr)->gsphere).rad);
            local_55c = local_55c + 1;
            bVar11 = true;
          }
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&sphere.super___shared_ptr<chrono::ChSphereShape,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          if (bVar11) {
            ChVisualMaterial::Default();
            ellipsoid.super___shared_ptr<chrono::ChEllipsoidShape,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr = *(element_type **)
                      &((sphere.
                         super___shared_ptr<chrono::ChSphereShape,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr)->super_ChVisualShape).field_0xc;
            ellipsoid.super___shared_ptr<chrono::ChEllipsoidShape,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi._0_4_ =
                 *(undefined4 *)
                  ((long)&((sphere.
                            super___shared_ptr<chrono::ChSphereShape,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr)->super_ChVisualShape).material_list.
                          super__Vector_base<std::shared_ptr<chrono::ChVisualMaterial>,_std::allocator<std::shared_ptr<chrono::ChVisualMaterial>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + 4);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&sphere.super___shared_ptr<chrono::ChSphereShape,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount);
            p_Var2 = *(__shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2> **)
                      (*pp_Var19 + 0x10);
            if (0 < (int)((ulong)(*(long *)(*pp_Var19 + 0x18) - (long)p_Var2) >> 4)) {
              std::__shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                        ((__shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2> *)
                         &sphere,p_Var2);
              if ((ChColor *)
                  &((sphere.super___shared_ptr<chrono::ChSphereShape,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->super_ChVisualShape).field_0xc != (ChColor *)&ellipsoid) {
                ellipsoid.super___shared_ptr<chrono::ChEllipsoidShape,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr = *(element_type **)
                          &((sphere.
                             super___shared_ptr<chrono::ChSphereShape,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr)->super_ChVisualShape).field_0xc;
                ellipsoid.super___shared_ptr<chrono::ChEllipsoidShape,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi._0_4_ =
                     *(undefined4 *)
                      ((long)&((sphere.
                                super___shared_ptr<chrono::ChSphereShape,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr)->super_ChVisualShape).material_list.
                              super__Vector_base<std::shared_ptr<chrono::ChVisualMaterial>,_std::allocator<std::shared_ptr<chrono::ChVisualMaterial>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + 4);
              }
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        (&sphere.
                          super___shared_ptr<chrono::ChSphereShape,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
            }
            box.super___shared_ptr<chrono::ChBoxShape,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ =
                 ((body_1.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 super_ChPhysicsItem).super_ChObj.m_identifier;
            pCVar15 = CSV_writer::operator<<(&csv,(int *)&box);
            iVar12 = (*((body_1.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr)->super_ChPhysicsItem).super_ChObj._vptr_ChObj[9])();
            capsule.super___shared_ptr<chrono::ChCapsuleShape,_(__gnu_cxx::_Lock_policy)2>._M_ptr.
            _0_1_ = (undefined1)iVar12;
            pCVar15 = CSV_writer::operator<<(pCVar15,(bool *)&capsule);
            pCVar15 = operator<<(pCVar15,&X_GS.coord.pos);
            pCVar15 = operator<<(pCVar15,&X_GS.coord.rot);
            pCVar15 = operator<<(pCVar15,(ChColor *)&ellipsoid);
            std::__cxx11::stringbuf::str();
            pCVar15 = CSV_writer::operator<<
                                (pCVar15,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)&sphere);
            std::endl<char,std::char_traits<char>>((ostream *)&pCVar15->m_ss);
            std::__cxx11::string::~string((string *)&sphere);
          }
          std::__cxx11::stringstream::~stringstream((stringstream *)&header);
        }
      }
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&body_1.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  iVar12 = 0;
  p_Var3 = &((system->assembly).linklist.
             super__Vector_base<std::shared_ptr<chrono::ChLinkBase>,_std::allocator<std::shared_ptr<chrono::ChLinkBase>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->
            super___shared_ptr<chrono::ChLinkBase,_(__gnu_cxx::_Lock_policy)2>;
  for (p_Var18 = &((system->assembly).linklist.
                   super__Vector_base<std::shared_ptr<chrono::ChLinkBase>,_std::allocator<std::shared_ptr<chrono::ChLinkBase>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->
                  super___shared_ptr<chrono::ChLinkBase,_(__gnu_cxx::_Lock_policy)2>;
      p_Var18 != p_Var3; p_Var18 = p_Var18 + 1) {
    std::__shared_ptr<chrono::ChLinkBase,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<chrono::ChLinkBase,_(__gnu_cxx::_Lock_policy)2> *)&ellipsoid,p_Var18);
    std::dynamic_pointer_cast<chrono::ChLinkLockRevolute,chrono::ChLinkBase>
              ((shared_ptr<chrono::ChLinkBase> *)&box);
    lVar4 = CONCAT44(box.super___shared_ptr<chrono::ChBoxShape,_(__gnu_cxx::_Lock_policy)2>._M_ptr.
                     _4_4_,(int)box.
                                super___shared_ptr<chrono::ChBoxShape,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr);
    if (lVar4 == 0) {
      std::dynamic_pointer_cast<chrono::ChLinkLockSpherical,chrono::ChLinkBase>
                ((shared_ptr<chrono::ChLinkBase> *)&capsule);
      lVar4 = CONCAT71(capsule.
                       super___shared_ptr<chrono::ChCapsuleShape,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                       ._1_7_,capsule.
                              super___shared_ptr<chrono::ChCapsuleShape,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr._0_1_);
      if (lVar4 == 0) {
        std::dynamic_pointer_cast<chrono::ChLinkLockPrismatic,chrono::ChLinkBase>
                  ((shared_ptr<chrono::ChLinkBase> *)&cylinder);
        if (cylinder.super___shared_ptr<chrono::ChCylinderShape,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            == (element_type *)0x0) {
          std::dynamic_pointer_cast<chrono::ChLinkLockCylindrical,chrono::ChLinkBase>
                    ((shared_ptr<chrono::ChLinkBase> *)&cone);
          if (cone.super___shared_ptr<chrono::ChConeShape,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            std::dynamic_pointer_cast<chrono::ChLinkUniversal,chrono::ChLinkBase>
                      ((shared_ptr<chrono::ChLinkBase> *)&rbox);
            if (rbox.super___shared_ptr<chrono::ChRoundedBoxShape,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr == (element_type *)0x0) {
              std::dynamic_pointer_cast<chrono::ChLinkTSDA,chrono::ChLinkBase>
                        ((shared_ptr<chrono::ChLinkBase> *)&sphere);
              if (sphere.super___shared_ptr<chrono::ChSphereShape,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr == (element_type *)0x0) {
                std::dynamic_pointer_cast<chrono::ChLinkDistance,chrono::ChLinkBase>
                          ((shared_ptr<chrono::ChLinkBase> *)&body_1);
                if (body_1.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                    (element_type *)0x0) {
                  std::dynamic_pointer_cast<chrono::ChLinkRevoluteSpherical,chrono::ChLinkBase>
                            ((shared_ptr<chrono::ChLinkBase> *)&rcyl);
                  if (CONCAT44(rcyl.
                               super___shared_ptr<chrono::ChRoundedCylinderShape,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr._4_4_,
                               rcyl.
                               super___shared_ptr<chrono::ChRoundedCylinderShape,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr._0_4_) != 0) {
                    mesh.super___shared_ptr<chrono::ChTriangleMeshShape,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr._0_4_ = 9;
                    pCVar15 = CSV_writer::operator<<(&csv,(POVRayLinkType *)&mesh);
                    ChLinkRevoluteSpherical::GetPoint1Abs
                              ((ChVector<double> *)&header,
                               (ChLinkRevoluteSpherical *)
                               CONCAT44(rcyl.
                                        super___shared_ptr<chrono::ChRoundedCylinderShape,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr._4_4_,
                                        rcyl.
                                        super___shared_ptr<chrono::ChRoundedCylinderShape,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr._0_4_));
                    pCVar15 = operator<<(pCVar15,(ChVector<double> *)&header);
                    ChLinkRevoluteSpherical::GetPoint2Abs
                              ((ChVector<double> *)&X_GS,
                               (ChLinkRevoluteSpherical *)
                               CONCAT44(rcyl.
                                        super___shared_ptr<chrono::ChRoundedCylinderShape,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr._4_4_,
                                        rcyl.
                                        super___shared_ptr<chrono::ChRoundedCylinderShape,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr._0_4_));
                    pCVar15 = operator<<(pCVar15,(ChVector<double> *)&X_GS);
                    std::endl<char,std::char_traits<char>>((ostream *)&pCVar15->m_ss);
                    iVar12 = iVar12 + 1;
                  }
                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                            (&rcyl.
                              super___shared_ptr<chrono::ChRoundedCylinderShape,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount);
                }
                else {
                  rcyl.
                  super___shared_ptr<chrono::ChRoundedCylinderShape,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr._0_4_ = 4;
                  pCVar15 = CSV_writer::operator<<(&csv,(POVRayLinkType *)&rcyl);
                  ChLinkDistance::GetEndPoint1Abs
                            ((ChVector<double> *)&header,
                             (ChLinkDistance *)
                             body_1.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr);
                  pCVar15 = operator<<(pCVar15,(ChVector<double> *)&header);
                  ChLinkDistance::GetEndPoint2Abs
                            ((ChVector<double> *)&X_GS,
                             (ChLinkDistance *)
                             body_1.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr);
                  pCVar15 = operator<<(pCVar15,(ChVector<double> *)&X_GS);
                  std::endl<char,std::char_traits<char>>((ostream *)&pCVar15->m_ss);
                  iVar12 = iVar12 + 1;
                }
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                          (&body_1.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
              }
              else {
                _header = (ChBody *)CONCAT44(uStack_34c,7);
                pCVar15 = CSV_writer::operator<<(&csv,(POVRayLinkType *)&header);
                pCVar15 = operator<<(pCVar15,(ChVector<double> *)
                                             &sphere.
                                              super___shared_ptr<chrono::ChSphereShape,_(__gnu_cxx::_Lock_policy)2>
                                              ._M_ptr[4].super_ChVisualShape.visible);
                pCVar15 = operator<<(pCVar15,(ChVector<double> *)
                                             &sphere.
                                              super___shared_ptr<chrono::ChSphereShape,_(__gnu_cxx::_Lock_policy)2>
                                              ._M_ptr[4].super_ChVisualShape.material_list.
                                              super__Vector_base<std::shared_ptr<chrono::ChVisualMaterial>,_std::allocator<std::shared_ptr<chrono::ChVisualMaterial>_>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
                std::endl<char,std::char_traits<char>>((ostream *)&pCVar15->m_ss);
                iVar12 = iVar12 + 1;
              }
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        (&sphere.
                          super___shared_ptr<chrono::ChSphereShape,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
            }
            else {
              ChLinkUniversal::GetFrame1Abs
                        ((ChFrame<double> *)&header,
                         (ChLinkUniversal *)
                         rbox.
                         super___shared_ptr<chrono::ChRoundedBoxShape,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr);
              ChLinkUniversal::GetFrame2Abs
                        (&X_GS,(ChLinkUniversal *)
                               rbox.
                               super___shared_ptr<chrono::ChRoundedBoxShape,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr);
              rcyl.super___shared_ptr<chrono::ChRoundedCylinderShape,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr._0_4_ = 3;
              pCVar15 = CSV_writer::operator<<(&csv,(POVRayLinkType *)&rcyl);
              pCVar15 = operator<<(pCVar15,local_348);
              sphere.super___shared_ptr<chrono::ChSphereShape,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   local_310;
              sphere.super___shared_ptr<chrono::ChSphereShape,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi = local_2f8;
              pCVar15 = operator<<(pCVar15,(ChVector<double> *)&sphere);
              body_1.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)
                   X_GS.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[1];
              body_1.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                      X_GS.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                      array[4];
              pCVar15 = operator<<(pCVar15,(ChVector<double> *)&body_1);
              std::endl<char,std::char_traits<char>>((ostream *)&pCVar15->m_ss);
              iVar12 = iVar12 + 1;
            }
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&rbox.
                        super___shared_ptr<chrono::ChRoundedBoxShape,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
          }
          else {
            ChFrameMoving<double>::operator>>
                      ((ChFrameMoving<double> *)&header,
                       (ChFrameMoving<double> *)
                       ((long)cone.
                              super___shared_ptr<chrono::ChConeShape,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr[1].gcone.rad.m_data[2] + 0x38),
                       (ChFrameMoving<double> *)
                       cone.super___shared_ptr<chrono::ChConeShape,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr[1].super_ChVisualShape.material_list.
                       super__Vector_base<std::shared_ptr<chrono::ChVisualMaterial>,_std::allocator<std::shared_ptr<chrono::ChVisualMaterial>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
            ChFrame<double>::ChFrame(&X_GS,(ChFrame<double> *)&header);
            ChFrameMoving<double>::operator>>
                      ((ChFrameMoving<double> *)&header,
                       (ChFrameMoving<double> *)
                       (cone.super___shared_ptr<chrono::ChConeShape,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr[2].super_ChVisualShape._vptr_ChVisualShape + 7),
                       (ChFrameMoving<double> *)
                       cone.super___shared_ptr<chrono::ChConeShape,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr[1].super_ChVisualShape.material_list.
                       super__Vector_base<std::shared_ptr<chrono::ChVisualMaterial>,_std::allocator<std::shared_ptr<chrono::ChVisualMaterial>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
            ChFrame<double>::ChFrame((ChFrame<double> *)&sphere,(ChFrame<double> *)&header);
            body_1.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)
                 CONCAT44(body_1.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr._4_4_,8);
            pCVar15 = CSV_writer::operator<<(&csv,(POVRayLinkType *)&body_1);
            pCVar15 = operator<<(pCVar15,&X_GS.coord.pos);
            _header = (ChBody *)
                      X_GS.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                      array[2];
            local_348[0].m_data[0] =
                 X_GS.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [5];
            local_348[0].m_data[1] =
                 X_GS.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [8];
            pCVar15 = operator<<(pCVar15,(ChVector<double> *)&header);
            std::endl<char,std::char_traits<char>>((ostream *)&pCVar15->m_ss);
            iVar12 = iVar12 + 1;
          }
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&cone.super___shared_ptr<chrono::ChConeShape,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
        }
        else {
          ChFrameMoving<double>::operator>>
                    ((ChFrameMoving<double> *)&header,
                     (ChFrameMoving<double> *)
                     ((long)cylinder.
                            super___shared_ptr<chrono::ChCylinderShape,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr[1].gcylinder.p2.m_data[1] + 0x38),
                     (ChFrameMoving<double> *)
                     cylinder.
                     super___shared_ptr<chrono::ChCylinderShape,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                     [1].super_ChVisualShape.material_list.
                     super__Vector_base<std::shared_ptr<chrono::ChVisualMaterial>,_std::allocator<std::shared_ptr<chrono::ChVisualMaterial>_>_>
                     ._M_impl.super__Vector_impl_data._M_start);
          ChFrame<double>::ChFrame(&X_GS,(ChFrame<double> *)&header);
          ChFrameMoving<double>::operator>>
                    ((ChFrameMoving<double> *)&header,
                     (ChFrameMoving<double> *)
                     ((long)cylinder.
                            super___shared_ptr<chrono::ChCylinderShape,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr[1].gcylinder.p2.m_data[2] + 0x38),
                     (ChFrameMoving<double> *)
                     cylinder.
                     super___shared_ptr<chrono::ChCylinderShape,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                     [1].super_ChVisualShape.material_list.
                     super__Vector_base<std::shared_ptr<chrono::ChVisualMaterial>,_std::allocator<std::shared_ptr<chrono::ChVisualMaterial>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
          ChFrame<double>::ChFrame((ChFrame<double> *)&sphere,(ChFrame<double> *)&header);
          body_1.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)
               CONCAT44(body_1.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                        ._4_4_,2);
          pCVar15 = CSV_writer::operator<<(&csv,(POVRayLinkType *)&body_1);
          pCVar15 = operator<<(pCVar15,&X_GS.coord.pos);
          _header = (ChBody *)
                    X_GS.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                    array[2];
          local_348[0].m_data[0] =
               X_GS.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [5];
          local_348[0].m_data[1] =
               X_GS.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [8];
          pCVar15 = operator<<(pCVar15,(ChVector<double> *)&header);
          std::endl<char,std::char_traits<char>>((ostream *)&pCVar15->m_ss);
          iVar12 = iVar12 + 1;
        }
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&cylinder.super___shared_ptr<chrono::ChCylinderShape,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
      }
      else {
        ChFrameMoving<double>::operator>>
                  ((ChFrameMoving<double> *)&header,
                   (ChFrameMoving<double> *)(*(long *)(lVar4 + 0xb8) + 0x38),
                   *(ChFrameMoving<double> **)(lVar4 + 0x78));
        ChFrame<double>::ChFrame(&X_GS,(ChFrame<double> *)&header);
        ChFrameMoving<double>::operator>>
                  ((ChFrameMoving<double> *)&header,
                   (ChFrameMoving<double> *)
                   (*(long *)(CONCAT71(capsule.
                                       super___shared_ptr<chrono::ChCapsuleShape,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr._1_7_,
                                       capsule.
                                       super___shared_ptr<chrono::ChCapsuleShape,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr._0_1_) + 0xc0) + 0x38),
                   *(ChFrameMoving<double> **)
                    (CONCAT71(capsule.
                              super___shared_ptr<chrono::ChCapsuleShape,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr._1_7_,
                              capsule.
                              super___shared_ptr<chrono::ChCapsuleShape,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr._0_1_) + 0x80));
        ChFrame<double>::ChFrame((ChFrame<double> *)&sphere,(ChFrame<double> *)&header);
        _header = (ChBody *)CONCAT44(uStack_34c,1);
        pCVar15 = CSV_writer::operator<<(&csv,(POVRayLinkType *)&header);
        pCVar15 = operator<<(pCVar15,&X_GS.coord.pos);
        std::endl<char,std::char_traits<char>>((ostream *)&pCVar15->m_ss);
        iVar12 = iVar12 + 1;
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&capsule.super___shared_ptr<chrono::ChCapsuleShape,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
    }
    else {
      ChFrameMoving<double>::operator>>
                ((ChFrameMoving<double> *)&header,
                 (ChFrameMoving<double> *)(*(long *)(lVar4 + 0xb8) + 0x38),
                 *(ChFrameMoving<double> **)(lVar4 + 0x78));
      ChFrame<double>::ChFrame(&X_GS,(ChFrame<double> *)&header);
      ChFrameMoving<double>::operator>>
                ((ChFrameMoving<double> *)&header,
                 (ChFrameMoving<double> *)
                 (*(long *)(CONCAT44(box.
                                     super___shared_ptr<chrono::ChBoxShape,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr._4_4_,
                                     (int)box.
                                          super___shared_ptr<chrono::ChBoxShape,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_ptr) + 0xc0) + 0x38),
                 *(ChFrameMoving<double> **)
                  (CONCAT44(box.super___shared_ptr<chrono::ChBoxShape,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr._4_4_,
                            (int)box.
                                 super___shared_ptr<chrono::ChBoxShape,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr) + 0x80));
      ChFrame<double>::ChFrame((ChFrame<double> *)&sphere,(ChFrame<double> *)&header);
      body_1.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           ((ulong)body_1.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr &
           0xffffffff00000000);
      pCVar15 = CSV_writer::operator<<(&csv,(POVRayLinkType *)&body_1);
      pCVar15 = operator<<(pCVar15,&X_GS.coord.pos);
      _header = (ChBody *)
                X_GS.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [2];
      local_348[0].m_data[0] =
           X_GS.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
      local_348[0].m_data[1] =
           X_GS.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
      pCVar15 = operator<<(pCVar15,(ChVector<double> *)&header);
      std::endl<char,std::char_traits<char>>((ostream *)&pCVar15->m_ss);
      iVar12 = iVar12 + 1;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&box.super___shared_ptr<chrono::ChBoxShape,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&ellipsoid.super___shared_ptr<chrono::ChEllipsoidShape,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  iVar13 = 0;
  p_Var18 = &((system->assembly).linklist.
              super__Vector_base<std::shared_ptr<chrono::ChLinkBase>,_std::allocator<std::shared_ptr<chrono::ChLinkBase>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->
             super___shared_ptr<chrono::ChLinkBase,_(__gnu_cxx::_Lock_policy)2>;
  p_Var3 = &((system->assembly).linklist.
             super__Vector_base<std::shared_ptr<chrono::ChLinkBase>,_std::allocator<std::shared_ptr<chrono::ChLinkBase>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->
            super___shared_ptr<chrono::ChLinkBase,_(__gnu_cxx::_Lock_policy)2>;
  do {
    if (p_Var18 == p_Var3) {
      std::__cxx11::stringstream::stringstream((stringstream *)&header);
      poVar16 = (ostream *)std::ostream::operator<<(local_348[0].m_data + 1,local_534);
      poVar16 = std::operator<<(poVar16,(string *)delim);
      poVar16 = (ostream *)std::ostream::operator<<(poVar16,local_55c);
      poVar16 = std::operator<<(poVar16,(string *)delim);
      poVar16 = (ostream *)std::ostream::operator<<(poVar16,iVar12);
      poVar16 = std::operator<<(poVar16,(string *)delim);
      poVar16 = (ostream *)std::ostream::operator<<(poVar16,iVar13);
      poVar16 = std::operator<<(poVar16,(string *)delim);
      std::endl<char,std::char_traits<char>>(poVar16);
      std::__cxx11::stringbuf::str();
      CSV_writer::write_to_file(&csv,filename,(string *)&X_GS);
      std::__cxx11::string::~string((string *)&X_GS);
      std::__cxx11::stringstream::~stringstream((stringstream *)&header);
      CSV_writer::~CSV_writer(&csv);
      return;
    }
    std::__shared_ptr<chrono::ChLinkBase,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<chrono::ChLinkBase,_(__gnu_cxx::_Lock_policy)2> *)&header,p_Var18);
    std::dynamic_pointer_cast<chrono::ChLinkTSDA,chrono::ChLinkBase>
              ((shared_ptr<chrono::ChLinkBase> *)&X_GS);
    if (CONCAT44(X_GS._vptr_ChFrame._4_4_,(int)X_GS._vptr_ChFrame) != 0) {
      ChPhysicsItem::GetVisualModel((ChPhysicsItem *)&sphere);
      peVar9 = sphere.super___shared_ptr<chrono::ChSphereShape,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&sphere.super___shared_ptr<chrono::ChSphereShape,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      if (peVar9 != (element_type *)0x0) {
        ChPhysicsItem::GetVisualModel((ChPhysicsItem *)&sphere);
        peVar9 = sphere.super___shared_ptr<chrono::ChSphereShape,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        ;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&sphere.super___shared_ptr<chrono::ChSphereShape,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        pp_Var1 = *(_func_int ***)&(peVar9->super_ChVisualShape).visible;
        for (pp_Var19 = (peVar9->super_ChVisualShape)._vptr_ChVisualShape; pp_Var19 != pp_Var1;
            pp_Var19 = pp_Var19 + 0x13) {
          std::dynamic_pointer_cast<chrono::ChSegmentShape,chrono::ChVisualShape>
                    ((shared_ptr<chrono::ChVisualShape> *)&sphere);
          peVar9 = sphere.super___shared_ptr<chrono::ChSphereShape,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&sphere.super___shared_ptr<chrono::ChSphereShape,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          if (peVar9 == (element_type *)0x0) {
            std::dynamic_pointer_cast<chrono::ChSpringShape,chrono::ChVisualShape>
                      ((shared_ptr<chrono::ChVisualShape> *)&sphere);
            peVar9 = sphere.super___shared_ptr<chrono::ChSphereShape,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&sphere.super___shared_ptr<chrono::ChSphereShape,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount);
            if (peVar9 != (element_type *)0x0) {
              sphere.super___shared_ptr<chrono::ChSphereShape,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)
                   CONCAT44(sphere.
                            super___shared_ptr<chrono::ChSphereShape,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr._4_4_,1);
              pCVar15 = CSV_writer::operator<<(&csv,(POVRayLineType *)&sphere);
              pCVar15 = operator<<(pCVar15,(ChVector<double> *)
                                           (CONCAT44(X_GS._vptr_ChFrame._4_4_,
                                                     (int)X_GS._vptr_ChFrame) + 0xe8));
              pCVar15 = operator<<(pCVar15,(ChVector<double> *)
                                           (CONCAT44(X_GS._vptr_ChFrame._4_4_,
                                                     (int)X_GS._vptr_ChFrame) + 0x100));
              std::endl<char,std::char_traits<char>>((ostream *)&pCVar15->m_ss);
              goto LAB_00e3db11;
            }
          }
          else {
            sphere.super___shared_ptr<chrono::ChSphereShape,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)
                 ((ulong)sphere.
                         super___shared_ptr<chrono::ChSphereShape,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr & 0xffffffff00000000);
            pCVar15 = CSV_writer::operator<<(&csv,(POVRayLineType *)&sphere);
            pCVar15 = operator<<(pCVar15,(ChVector<double> *)
                                         (CONCAT44(X_GS._vptr_ChFrame._4_4_,(int)X_GS._vptr_ChFrame)
                                         + 0xe8));
            pCVar15 = operator<<(pCVar15,(ChVector<double> *)
                                         (CONCAT44(X_GS._vptr_ChFrame._4_4_,(int)X_GS._vptr_ChFrame)
                                         + 0x100));
            std::endl<char,std::char_traits<char>>((ostream *)&pCVar15->m_ss);
LAB_00e3db11:
            iVar13 = iVar13 + 1;
          }
        }
      }
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&X_GS.coord);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_348);
    p_Var18 = p_Var18 + 1;
  } while( true );
}

Assistant:

void WriteVisualizationAssets(ChSystem* system,
                              const std::string& filename,
                              std::function<bool(const ChBody&)> selector,
                              bool body_info,
                              const std::string& delim) {
    CSV_writer csv(delim);

    // If requested, Loop over all bodies and write out their position and
    // orientation.  Otherwise, body count is left at 0.
    int b_count = 0;

    if (body_info) {
        for (auto body : system->Get_bodylist()) {
            if (!selector(*body))
                continue;

            const ChVector<>& body_pos = body->GetFrame_REF_to_abs().GetPos();
            const ChQuaternion<>& body_rot = body->GetFrame_REF_to_abs().GetRot();

            csv << body->GetIdentifier() << body->IsActive() << body_pos << body_rot << std::endl;

            b_count++;
        }
    }

    // Loop over all bodies and over all their assets.
    int a_count = 0;
    for (auto body : system->Get_bodylist()) {
        if (!selector(*body))
            continue;

        if (!body->GetVisualModel())
            continue;

        // Loop over visual shapes -- write information for supported types.
        for (auto& shape_instance : body->GetVisualModel()->GetShapes()) {
            auto& shape = shape_instance.first;
            auto X_GS = body->GetFrame_REF_to_abs() * shape_instance.second;
            auto& pos = X_GS.GetPos();
            auto& rot = X_GS.GetRot();

            bool supported = true;
            std::stringstream gss;

            if (auto sphere = std::dynamic_pointer_cast<ChSphereShape>(shape)) {
                gss << SPHERE << delim << sphere->GetSphereGeometry().rad;
                a_count++;
            } else if (auto ellipsoid = std::dynamic_pointer_cast<ChEllipsoidShape>(shape)) {
                const Vector& size = ellipsoid->GetEllipsoidGeometry().rad;
                gss << ELLIPSOID << delim << size.x() << delim << size.y() << delim << size.z();
                a_count++;
            } else if (auto box = std::dynamic_pointer_cast<ChBoxShape>(shape)) {
                const Vector& size = box->GetBoxGeometry().Size;
                gss << BOX << delim << size.x() << delim << size.y() << delim << size.z();
                a_count++;
            } else if (auto capsule = std::dynamic_pointer_cast<ChCapsuleShape>(shape)) {
                const geometry::ChCapsule& geom = capsule->GetCapsuleGeometry();
                gss << CAPSULE << delim << geom.rad << delim << geom.hlen;
                a_count++;
            } else if (auto cylinder = std::dynamic_pointer_cast<ChCylinderShape>(shape)) {
                const geometry::ChCylinder& geom = cylinder->GetCylinderGeometry();
                gss << CYLINDER << delim << geom.rad << delim << geom.p1.x() << delim << geom.p1.y() << delim
                    << geom.p1.z() << delim << geom.p2.x() << delim << geom.p2.y() << delim << geom.p2.z();
                a_count++;
            } else if (auto cone = std::dynamic_pointer_cast<ChConeShape>(shape)) {
                const geometry::ChCone& geom = cone->GetConeGeometry();
                gss << CONE << delim << geom.rad.x() << delim << geom.rad.y();
                a_count++;
            } else if (auto rbox = std::dynamic_pointer_cast<ChRoundedBoxShape>(shape)) {
                const geometry::ChRoundedBox& geom = rbox->GetRoundedBoxGeometry();
                gss << ROUNDEDBOX << delim << geom.Size.x() << delim << geom.Size.y() << delim << geom.Size.z() << delim
                    << geom.radsphere;
                a_count++;
            } else if (auto rcyl = std::dynamic_pointer_cast<ChRoundedCylinderShape>(shape)) {
                const geometry::ChRoundedCylinder& geom = rcyl->GetRoundedCylinderGeometry();
                gss << ROUNDEDCYL << delim << geom.rad << delim << geom.hlen << delim << geom.radsphere;
                a_count++;
            } else if (auto mesh = std::dynamic_pointer_cast<ChTriangleMeshShape>(shape)) {
                gss << TRIANGLEMESH << delim << "\"" << mesh->GetName() << "\"";
                a_count++;
            } else if (auto line = std::dynamic_pointer_cast<ChLineShape>(shape)) {
                std::shared_ptr<geometry::ChLine> geom = line->GetLineGeometry();
                if (auto bezier = std::dynamic_pointer_cast<geometry::ChLineBezier>(geom)) {
                    gss << BEZIER << delim << "\"" << line->GetName() << "\"";
                    a_count++;
                } else {
                    supported = false;
                }
            } else {
                supported = false;
            }

            if (supported) {
                ChColor col = ChVisualMaterial::Default()->GetDiffuseColor();
                if (shape->GetNumMaterials() > 0)
                    col = shape->GetMaterial(0)->GetDiffuseColor();
                csv << body->GetIdentifier() << body->IsActive() << pos << rot << col << gss.str() << std::endl;
            }
        }
    }

    // Loop over all links.  Write information on selected types of links.
    int l_count = 0;
    for (auto ilink : system->Get_linklist()) {
        if (auto linkR = std::dynamic_pointer_cast<ChLinkLockRevolute>(ilink)) {
            chrono::ChFrame<> frA_abs = *(linkR->GetMarker1()) >> *(linkR->GetBody1());
            chrono::ChFrame<> frB_abs = *(linkR->GetMarker2()) >> *(linkR->GetBody2());

            csv << REVOLUTE << frA_abs.GetPos() << frA_abs.GetA().Get_A_Zaxis() << std::endl;
            l_count++;
        } else if (auto linkS = std::dynamic_pointer_cast<ChLinkLockSpherical>(ilink)) {
            chrono::ChFrame<> frA_abs = *(linkS->GetMarker1()) >> *(linkS->GetBody1());
            chrono::ChFrame<> frB_abs = *(linkS->GetMarker2()) >> *(linkS->GetBody2());

            csv << SPHERICAL << frA_abs.GetPos() << std::endl;
            l_count++;
        } else if (auto linkP = std::dynamic_pointer_cast<ChLinkLockPrismatic>(ilink)) {
            chrono::ChFrame<> frA_abs = *(linkP->GetMarker1()) >> *(linkP->GetBody1());
            chrono::ChFrame<> frB_abs = *(linkP->GetMarker2()) >> *(linkP->GetBody2());

            csv << PRISMATIC << frA_abs.GetPos() << frA_abs.GetA().Get_A_Zaxis() << std::endl;
            l_count++;
        } else if (auto linkC = std::dynamic_pointer_cast<ChLinkLockCylindrical>(ilink)) {
            chrono::ChFrame<> frA_abs = *(linkC->GetMarker1()) >> *(linkC->GetBody1());
            chrono::ChFrame<> frB_abs = *(linkC->GetMarker2()) >> *(linkC->GetBody2());

            csv << CYLINDRICAL << frA_abs.GetPos() << frA_abs.GetA().Get_A_Zaxis() << std::endl;
            l_count++;
        } else if (auto linkU = std::dynamic_pointer_cast<ChLinkUniversal>(ilink)) {
            chrono::ChFrame<> frA_abs = linkU->GetFrame1Abs();
            chrono::ChFrame<> frB_abs = linkU->GetFrame2Abs();

            csv << UNIVERSAL << frA_abs.GetPos() << frA_abs.GetA().Get_A_Xaxis() << frB_abs.GetA().Get_A_Yaxis()
                << std::endl;
            l_count++;
        } else if (auto linkT = std::dynamic_pointer_cast<ChLinkTSDA>(ilink)) {
            csv << TSDA << linkT->GetPoint1Abs() << linkT->GetPoint2Abs() << std::endl;
            l_count++;
        } else if (auto linkD = std::dynamic_pointer_cast<ChLinkDistance>(ilink)) {
            csv << DISTANCE << linkD->GetEndPoint1Abs() << linkD->GetEndPoint2Abs() << std::endl;
            l_count++;
        } else if (auto linkRS = std::dynamic_pointer_cast<ChLinkRevoluteSpherical>(ilink)) {
            csv << REV_SPH << linkRS->GetPoint1Abs() << linkRS->GetPoint2Abs() << std::endl;
            l_count++;
        }
    }

    // Loop over links and write assets associated with spring-dampers.
    int la_count = 0;
    for (auto ilink : system->Get_linklist()) {
        auto link = std::dynamic_pointer_cast<ChLinkTSDA>(ilink);
        if (!link)
            continue;
        if (!link->GetVisualModel())
            continue;
        for (auto& shape_instance : link->GetVisualModel()->GetShapes()) {
            auto& shape = shape_instance.first;
            if (std::dynamic_pointer_cast<ChSegmentShape>(shape)) {
                csv << SEGMENT << link->GetPoint1Abs() << link->GetPoint2Abs() << std::endl;
                la_count++;
            } else if (std::dynamic_pointer_cast<ChSpringShape>(shape)) {
                csv << COIL << link->GetPoint1Abs() << link->GetPoint2Abs() << std::endl;
                la_count++;
            }
        }
    }

    // Write the output file, including a first line with number of bodies, visual
    // assets, links, and TSDA assets.
    std::stringstream header;
    header << b_count << delim << a_count << delim << l_count << delim << la_count << delim << std::endl;

    csv.write_to_file(filename, header.str());
}